

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_go.cpp
# Opt level: O2

void __thiscall
flatbuffers::go::GoGenerator::MutateScalarFieldOfStruct
          (GoGenerator *this,StructDef *struct_def,FieldDef *field,string *code_ptr)

{
  IdlNamer *pIVar1;
  string *psVar2;
  Value *type;
  string setter;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_f8;
  string local_d8;
  string *local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  string local_90;
  string local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  pIVar1 = &this->namer_;
  type = &field->value;
  local_b8 = code_ptr;
  GenTypeBasic_abi_cxx11_(&local_d8,this,&type->type);
  (*(this->namer_).super_Namer._vptr_Namer[0x14])
            (&bStack_f8,pIVar1,&local_d8,(ulong)(this->namer_).super_Namer.config_.methods);
  std::operator+(&local_50,"rcv._tab.Mutate",&bStack_f8);
  std::__cxx11::string::~string((string *)&bStack_f8);
  std::__cxx11::string::~string((string *)&local_d8);
  psVar2 = local_b8;
  GenReceiver(this,struct_def,local_b8);
  (*(pIVar1->super_Namer)._vptr_Namer[6])(&local_d8,pIVar1,field);
  std::operator+(&bStack_f8," Mutate",&local_d8);
  std::__cxx11::string::append((string *)psVar2);
  std::__cxx11::string::~string((string *)&bStack_f8);
  std::__cxx11::string::~string((string *)&local_d8);
  GenTypeGet_abi_cxx11_(&local_70,this,&type->type);
  std::operator+(&local_b0,"(n ",&local_70);
  std::operator+(&local_d8,&local_b0,") bool {\n\treturn ");
  std::operator+(&bStack_f8,&local_d8,&local_50);
  std::__cxx11::string::append((string *)psVar2);
  std::__cxx11::string::~string((string *)&bStack_f8);
  std::__cxx11::string::~string((string *)&local_d8);
  std::__cxx11::string::~string((string *)&local_b0);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::append((char *)psVar2);
  NumToString<unsigned_short>(&local_d8,(field->value).offset);
  std::operator+(&bStack_f8,&local_d8,"), ");
  std::__cxx11::string::append((string *)psVar2);
  std::__cxx11::string::~string((string *)&bStack_f8);
  std::__cxx11::string::~string((string *)&local_d8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_90,"n",(allocator<char> *)&local_b0);
  CastToBaseType(&local_d8,this,&type->type,&local_90);
  std::operator+(&bStack_f8,&local_d8,")\n}\n\n");
  std::__cxx11::string::append((string *)psVar2);
  std::__cxx11::string::~string((string *)&bStack_f8);
  std::__cxx11::string::~string((string *)&local_d8);
  std::__cxx11::string::~string((string *)&local_90);
  std::__cxx11::string::~string((string *)&local_50);
  return;
}

Assistant:

void MutateScalarFieldOfStruct(const StructDef &struct_def,
                                 const FieldDef &field, std::string *code_ptr) {
    std::string &code = *code_ptr;
    std::string setter =
        "rcv._tab.Mutate" + namer_.Method(GenTypeBasic(field.value.type));
    GenReceiver(struct_def, code_ptr);
    code += " Mutate" + namer_.Function(field);
    code +=
        "(n " + GenTypeGet(field.value.type) + ") bool {\n\treturn " + setter;
    code += "(rcv._tab.Pos+flatbuffers.UOffsetT(";
    code += NumToString(field.value.offset) + "), ";
    code += CastToBaseType(field.value.type, "n") + ")\n}\n\n";
  }